

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshglob.c
# Opt level: O1

void psh_globals_scale_widths(PSH_Globals globals,FT_UInt direction)

{
  FT_UInt FVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  PSH_WidthRec *pPVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  FVar1 = globals->dimension[direction].stdw.count;
  if (FVar1 != 0) {
    lVar3 = (long)(int)globals->dimension[direction].scale_mult;
    lVar4 = globals->dimension[direction].stdw.widths[0].org * lVar3;
    lVar4 = (long)(int)((ulong)(lVar4 + (lVar4 >> 0x3f) + 0x8000) >> 0x10);
    globals->dimension[direction].stdw.widths[0].cur = lVar4;
    globals->dimension[direction].stdw.widths[0].fit = lVar4 + 0x20U & 0xffffffffffffffc0;
    iVar2 = FVar1 - 1;
    if (iVar2 != 0) {
      pPVar5 = globals->dimension[direction].stdw.widths;
      do {
        pPVar5 = pPVar5 + 1;
        lVar4 = pPVar5->org * lVar3;
        lVar6 = (long)(int)((ulong)(lVar4 + (lVar4 >> 0x3f) + 0x8000) >> 0x10);
        lVar4 = globals->dimension[direction].stdw.widths[0].cur;
        uVar7 = lVar6 - lVar4;
        uVar8 = -uVar7;
        if (0 < (long)uVar7) {
          uVar8 = uVar7;
        }
        if (0x7f < uVar8) {
          lVar4 = lVar6;
        }
        pPVar5->cur = lVar4;
        pPVar5->fit = lVar4 + 0x20U & 0xffffffffffffffc0;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
  }
  return;
}

Assistant:

static void
  psh_globals_scale_widths( PSH_Globals  globals,
                            FT_UInt      direction )
  {
    PSH_Dimension  dim   = &globals->dimension[direction];
    PSH_Widths     stdw  = &dim->stdw;
    FT_UInt        count = stdw->count;
    PSH_Width      width = stdw->widths;
    PSH_Width      stand = width;               /* standard width/height */
    FT_Fixed       scale = dim->scale_mult;


    if ( count > 0 )
    {
      width->cur = FT_MulFix( width->org, scale );
      width->fit = FT_PIX_ROUND( width->cur );

      width++;
      count--;

      for ( ; count > 0; count--, width++ )
      {
        FT_Pos  w, dist;


        w    = FT_MulFix( width->org, scale );
        dist = w - stand->cur;

        if ( dist < 0 )
          dist = -dist;

        if ( dist < 128 )
          w = stand->cur;

        width->cur = w;
        width->fit = FT_PIX_ROUND( w );
      }
    }
  }